

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_events_cpp.cpp
# Opt level: O1

int main(void)

{
  _Bool _Var1;
  uint uVar2;
  mfb_update_state mVar3;
  mfb_window *window;
  mfb_stub *pmVar4;
  uint uVar5;
  long lVar6;
  Events e;
  Events local_41;
  _Bind<void_(Events::*(Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>))(mfb_window_*,_mfb_key,_mfb_key_mod,_bool)>
  local_40;
  
  window = mfb_open_ex("Input Events CPP Test",800,600,1);
  if (window != (mfb_window *)0x0) {
    pmVar4 = mfb_stub::GetInstance(window);
    local_40._M_f = (offset_in_Events_to_subr)Events::active;
    lVar6 = 0;
    local_40._8_8_ = 0;
    local_40._M_bound_args.
    super__Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
    .super__Head_base<0UL,_Events_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
          )(_Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
            )&local_41;
    std::function<void(mfb_window*,bool)>::operator=
              ((function<void(mfb_window*,bool)> *)&pmVar4->m_active,
               (_Bind<void_(Events::*(Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(mfb_window_*,_bool)>
                *)&local_40);
    mfb_set_active_callback(window,mfb_stub::active_stub);
    pmVar4 = mfb_stub::GetInstance(window);
    local_40._M_f = (offset_in_Events_to_subr)Events::resize;
    local_40._8_8_ = 0;
    local_40._M_bound_args.
    super__Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
    .super__Head_base<0UL,_Events_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
          )(_Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
            )&local_41;
    std::function<void(mfb_window*,int,int)>::operator=
              ((function<void(mfb_window*,int,int)> *)&pmVar4->m_resize,
               (_Bind<void_(Events::*(Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(mfb_window_*,_int,_int)>
                *)&local_40);
    mfb_set_resize_callback(window,mfb_stub::resize_stub);
    pmVar4 = mfb_stub::GetInstance(window);
    local_40._M_f = (offset_in_Events_to_subr)Events::keyboard;
    local_40._8_8_ = 0;
    local_40._M_bound_args.
    super__Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
    .super__Head_base<0UL,_Events_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
          )(_Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
            )&local_41;
    std::function<void(mfb_window*,mfb_key,mfb_key_mod,bool)>::operator=
              ((function<void(mfb_window*,mfb_key,mfb_key_mod,bool)> *)&pmVar4->m_keyboard,&local_40
              );
    mfb_set_keyboard_callback(window,mfb_stub::keyboard_stub);
    pmVar4 = mfb_stub::GetInstance(window);
    local_40._M_f = (offset_in_Events_to_subr)Events::char_input;
    local_40._8_8_ = 0;
    local_40._M_bound_args.
    super__Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
    .super__Head_base<0UL,_Events_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
          )(_Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
            )&local_41;
    std::function<void(mfb_window*,unsigned_int)>::operator=
              ((function<void(mfb_window*,unsigned_int)> *)&pmVar4->m_char_input,
               (_Bind<void_(Events::*(Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(mfb_window_*,_unsigned_int)>
                *)&local_40);
    mfb_set_char_input_callback(window,mfb_stub::char_input_stub);
    pmVar4 = mfb_stub::GetInstance(window);
    local_40._M_f = (offset_in_Events_to_subr)Events::mouse_btn;
    local_40._8_8_ = 0;
    local_40._M_bound_args.
    super__Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
    .super__Head_base<0UL,_Events_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
          )(_Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
            )&local_41;
    std::function<void(mfb_window*,mfb_mouse_button,mfb_key_mod,bool)>::operator=
              ((function<void(mfb_window*,mfb_mouse_button,mfb_key_mod,bool)> *)&pmVar4->m_mouse_btn
               ,(_Bind<void_(Events::*(Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>))(mfb_window_*,_mfb_mouse_button,_mfb_key_mod,_bool)>
                 *)&local_40);
    mfb_set_mouse_button_callback(window,mfb_stub::mouse_btn_stub);
    pmVar4 = mfb_stub::GetInstance(window);
    local_40._M_f = (offset_in_Events_to_subr)Events::mouse_move;
    local_40._8_8_ = 0;
    local_40._M_bound_args.
    super__Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
    .super__Head_base<0UL,_Events_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
          )(_Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
            )&local_41;
    std::function<void(mfb_window*,int,int)>::operator=
              ((function<void(mfb_window*,int,int)> *)&pmVar4->m_mouse_move,
               (_Bind<void_(Events::*(Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(mfb_window_*,_int,_int)>
                *)&local_40);
    mfb_set_mouse_move_callback(window,mfb_stub::mouse_move_stub);
    pmVar4 = mfb_stub::GetInstance(window);
    local_40._M_f = (offset_in_Events_to_subr)Events::mouse_scroll;
    local_40._8_8_ = 0;
    local_40._M_bound_args.
    super__Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
    .super__Head_base<0UL,_Events_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
          )(_Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
            )&local_41;
    std::function<void(mfb_window*,mfb_key_mod,float,float)>::operator=
              ((function<void(mfb_window*,mfb_key_mod,float,float)> *)&pmVar4->m_scroll,
               (_Bind<void_(Events::*(Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>))(mfb_window_*,_mfb_key_mod,_float,_float)>
                *)&local_40);
    mfb_set_mouse_scroll_callback(window,mfb_stub::scroll_stub);
    mfb_set_user_data(window,"Input Events CPP Test");
    uVar5 = 0xbeef;
    do {
      do {
        uVar2 = (int)uVar5 >> 3 ^ uVar5;
        uVar5 = (uVar2 & 1) << 0x1e | (int)uVar5 >> 1;
        g_buffer[lVar6] = (uVar2 >> 1 & 0xff) * 0x10101;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 480000);
      mVar3 = mfb_update(window,g_buffer);
      if (mVar3 != STATE_OK) {
        return 0;
      }
      _Var1 = mfb_wait_sync(window);
      lVar6 = 0;
    } while (_Var1);
  }
  return 0;
}

Assistant:

int 
main()
{
    int noise, carry, seed = 0xbeef;

    struct mfb_window *window = mfb_open_ex("Input Events CPP Test", WIDTH, HEIGHT, WF_RESIZABLE);
    if (!window)
        return 0;

    Events e;

    mfb_set_active_callback(window, &e, &Events::active);
    mfb_set_resize_callback(window, &e, &Events::resize);
    mfb_set_keyboard_callback(window, &e, &Events::keyboard);
    mfb_set_char_input_callback(window, &e, &Events::char_input);
    mfb_set_mouse_button_callback(window, &e, &Events::mouse_btn);
    mfb_set_mouse_move_callback(window, &e, &Events::mouse_move);
    mfb_set_mouse_scroll_callback(window, &e, &Events::mouse_scroll);

    mfb_set_user_data(window, (void *) "Input Events CPP Test");

    do {
        int         i;
        mfb_update_state state;

        for (i = 0; i < WIDTH * HEIGHT; ++i) {
            noise = seed;
            noise >>= 3;
            noise ^= seed;
            carry = noise & 1;
            noise >>= 1;
            seed >>= 1;
            seed |= (carry << 30);
            noise &= 0xFF;
            g_buffer[i] = MFB_RGB(noise, noise, noise); 
        }

        state = mfb_update(window, g_buffer);
        if (state != STATE_OK) {
            window = 0x0;
            break;
        }
    } while(mfb_wait_sync(window));

    return 0;
}